

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_measurement *
units::measurement_from_string(string *measurement_string,uint64_t match_flags)

{
  bool bVar1;
  undefined1 uVar2;
  string *measurement_string_00;
  size_type sVar3;
  ulong in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  precise_measurement *in_RDI;
  bool bVar4;
  double val_00;
  precise_unit pVar5;
  uint64_t in_stack_00000080;
  string *in_stack_00000088;
  precise_unit unit;
  precise_measurement mstr;
  precise_unit c;
  precise_unit un;
  bool validString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ustring;
  bool checkCurrency;
  double val;
  size_t loc;
  uint64_t in_stack_00000d18;
  string *in_stack_00000d20;
  undefined4 in_stack_fffffffffffffdf8;
  uint32_t in_stack_fffffffffffffdfc;
  unit_data in_stack_fffffffffffffe00;
  unit_data in_stack_fffffffffffffe04;
  precise_unit *in_stack_fffffffffffffe08;
  precise_unit *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  precise_unit *base;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  string *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  string *in_stack_fffffffffffffeb0;
  precise_unit local_130 [6];
  precise_unit local_c8;
  undefined4 local_b4;
  precise_unit local_b0;
  unit_data local_9c;
  unit_data local_98;
  byte local_91;
  precise_unit local_70;
  size_t *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  double local_20;
  ulong uVar6;
  ulong match_flags_00;
  
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7738af);
  if (bVar1) {
    precise_measurement::precise_measurement((precise_measurement *)0x7738c2);
    return in_RDI;
  }
  measurement_string_00 = (string *)(in_RDX & 0xffffffefffffffff);
  cleanUnitString(in_stack_00000088,in_stack_00000080);
  uVar6 = 0;
  local_20 = generateLeadingNumber
                       (in_stack_fffffffffffffe88,
                        (size_t *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  if (uVar6 == 0) {
    local_20 = readNumericalWords(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  }
  if (uVar6 == 0) {
    local_20 = 1.0;
  }
  match_flags_00 = uVar6;
  sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          length(in_RSI);
  if (sVar3 <= uVar6) {
    precise_measurement::precise_measurement(in_RDI,local_20,(precise_unit *)&precise::one);
    return in_RDI;
  }
  bVar4 = match_flags_00 == 0;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (in_stack_fffffffffffffe18,(size_type)in_stack_fffffffffffffe10,
             (size_type)in_stack_fffffffffffffe08);
  bVar1 = checkValidUnitString
                    ((string *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  local_91 = 0;
  if (bVar1) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe38);
    local_91 = 1;
    local_70 = unit_from_string_internal(in_stack_00000d20,in_stack_00000d18);
  }
  else {
    local_70.base_units_ = (unit_data)0xfa94a488;
    local_70.commodity_ = 0;
    local_70.multiplier_ = NAN;
  }
  if ((local_91 & 1) != 0) {
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  }
  bVar1 = is_error(in_stack_fffffffffffffe10);
  pVar5.base_units_ = local_c8.base_units_;
  pVar5.commodity_ = local_c8.commodity_;
  pVar5.multiplier_ = local_c8.multiplier_;
  if (bVar1) {
    local_c8 = pVar5;
    if (bVar4) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_fffffffffffffe18,(size_type)in_stack_fffffffffffffe10,
                 (size_type)in_stack_fffffffffffffe08);
      local_c8 = get_unit(in_stack_fffffffffffffeb0,
                          CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      uVar2 = precise_unit::operator==
                        (in_stack_fffffffffffffe08,
                         (precise_unit *)
                         CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      if ((bool)uVar2) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_fffffffffffffe18,(size_type)in_stack_fffffffffffffe10,
                   (size_type)in_stack_fffffffffffffe08);
        measurement_from_string(measurement_string_00,match_flags_00);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        precise_measurement::operator*
                  ((precise_measurement *)CONCAT17(uVar2,in_stack_fffffffffffffe20),
                   (precise_unit *)in_stack_fffffffffffffe18);
        goto LAB_00773f12;
      }
    }
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe38);
    pVar5 = unit_from_string_internal(in_stack_00000d20,in_stack_00000d18);
    local_130[0] = pVar5;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    bVar1 = is_valid(pVar5._8_8_);
    in_stack_fffffffffffffe04._3_1_ = bVar1;
    if (bVar1) {
      in_stack_fffffffffffffe00 = units::unit::base_units((unit *)&one);
      bVar1 = precise_unit::has_same_base
                        ((precise_unit *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                         in_stack_fffffffffffffe04);
      if (!bVar1) {
        precise_measurement::precise_measurement(in_RDI,1.0,local_130);
        goto LAB_00773f12;
      }
    }
    precise_measurement::precise_measurement(in_RDI,local_20,(precise_unit *)&precise::invalid);
  }
  else {
    if (bVar4) {
      local_98 = precise_unit::base_units(&local_70);
      local_9c = precise_unit::base_units((precise_unit *)precise::currency);
      bVar1 = detail::unit_data::operator==
                        ((unit_data *)in_stack_fffffffffffffe10,
                         (unit_data *)in_stack_fffffffffffffe08);
      if (bVar1) {
        val_00 = precise_unit::multiplier(&local_70);
        precise_unit::commodity(&local_70);
        base = &local_b0;
        precise_unit::precise_unit
                  (in_stack_fffffffffffffe10,(double)in_stack_fffffffffffffe08,
                   (precise_unit *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   in_stack_fffffffffffffdfc);
        precise_measurement::precise_measurement(in_RDI,val_00,base);
        goto LAB_00773f12;
      }
    }
    precise_measurement::precise_measurement(in_RDI,local_20,&local_70);
  }
LAB_00773f12:
  local_b4 = 1;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  return in_RDI;
}

Assistant:

precise_measurement measurement_from_string(
    std::string measurement_string,
    std::uint64_t match_flags)
{
    if (measurement_string.empty()) {
        return {};
    }
    // do a cleaning first to get rid of spaces and other issues
    match_flags &= (~skip_code_replacements);
    cleanUnitString(measurement_string, match_flags);

    size_t loc{0};
    auto val = generateLeadingNumber(measurement_string, loc);
    if (loc == 0) {
        val = readNumericalWords(measurement_string, loc);
    }
    if (loc == 0) {
        val = 1.0;
    }
    if (loc >= measurement_string.length()) {
        return {val, precise::one};
    }
    bool checkCurrency = (loc == 0);
    auto ustring = measurement_string.substr(loc);
    auto validString = checkValidUnitString(ustring, match_flags);
    auto un = (validString) ?
        unit_from_string_internal(
            std::move(ustring), match_flags | skip_code_replacements) :
        precise::invalid;
    if (!is_error(un)) {
        if (checkCurrency) {
            if (un.base_units() == precise::currency.base_units()) {
                return {
                    un.multiplier(),
                    precise_unit(1.0, precise::currency, un.commodity())};
            }
        }
        return {val, un};
    }
    if (checkCurrency) {
        auto c = get_unit(measurement_string.substr(0, 1), match_flags);
        if (c == precise::currency) {
            auto mstr = measurement_from_string(
                measurement_string.substr(1), match_flags);
            return mstr * c;
        }
    }

    // deal with some specifics
    /*
    if (measurement_string[loc] == '\'')
    {
        double v2 = std::stod(measurement_string.substr(loc + 1), &loc);
        if (measurement_string[loc] == '"')
        {
            return precise_measurement(val, precise::ft) +
    precise_measurement(v2, precise::in);
        }
    }
    */
    auto unit = unit_from_string_internal(
        std::move(measurement_string), match_flags | skip_code_replacements);
    if (is_valid(unit) && !unit.has_same_base(one.base_units())) {
        return {1.0, unit};
    }
    return {val, precise::invalid};
}